

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool __thiscall testing::UnitTest::Failed(UnitTest *this)

{
  bool bVar1;
  UnitTestImpl *this_00;
  UnitTest *this_local;
  
  this_00 = impl(this);
  bVar1 = internal::UnitTestImpl::Failed(this_00);
  return bVar1;
}

Assistant:

bool UnitTest::Failed() const { return impl()->Failed(); }